

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlTruncate(sqlite3_file *pJfd,sqlite_int64 size)

{
  sqlite3_io_methods *psVar1;
  MemJournal *p;
  sqlite3_io_methods *p_00;
  
  p_00 = pJfd[1].pMethods;
  while (p_00 != (sqlite3_io_methods *)0x0) {
    psVar1 = *(sqlite3_io_methods **)p_00;
    sqlite3_free(p_00);
    p_00 = psVar1;
  }
  pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
  pJfd->pMethods = &MemJournalMethods;
  return 0;
}

Assistant:

static int memjrnlTruncate(sqlite3_file *pJfd, sqlite_int64 size){
  MemJournal *p = (MemJournal *)pJfd;
  FileChunk *pChunk;
  assert(size==0);
  UNUSED_PARAMETER(size);
  pChunk = p->pFirst;
  while( pChunk ){
    FileChunk *pTmp = pChunk;
    pChunk = pChunk->pNext;
    sqlite3_free(pTmp);
  }
  sqlite3MemJournalOpen(pJfd);
  return SQLITE_OK;
}